

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall IlmThread_3_2::ThreadPool::addTask(ThreadPool *this,Task *task)

{
  TaskGroup *pTVar1;
  Data *pDVar2;
  ProviderPtr p;
  Data local_20;
  
  if (task != (Task *)0x0) {
    Data::getProvider(&local_20);
    if (local_20._provider.
        super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      pTVar1 = task->_group;
      (*task->_vptr_Task[2])(task);
      (*task->_vptr_Task[1])(task);
      if (pTVar1 != (TaskGroup *)0x0) {
        pDVar2 = pTVar1->_data;
        LOCK();
        (pDVar2->numPending).super___atomic_base<int>._M_i =
             (pDVar2->numPending).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->numPending).super___atomic_base<int>._M_i == 0) {
          Semaphore::post(&pDVar2->isEmpty);
        }
        LOCK();
        (pDVar2->inFlight).super___atomic_base<int>._M_i =
             (pDVar2->inFlight).super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
    }
    else {
      (*(local_20._provider.
         super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_ThreadPoolProvider[4])
                (local_20._provider.
                 super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,task);
    }
    if (local_20._provider.
        super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20._provider.
                 super___shared_ptr<IlmThread_3_2::ThreadPoolProvider,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void
ThreadPool::addTask (Task* task)
{
    if (task)
    {
#ifdef ENABLE_THREADING
        Data::ProviderPtr p = _data->getProvider ();
        if (p)
        {
            p->addTask (task);
            return;
        }
#endif

        handleProcessTask (task);
    }
}